

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_NewObjectProtoClass(JSContext *ctx,JSValue proto_val,JSClassID class_id)

{
  JSContext *ctx_00;
  JSShape *pJVar1;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValue JVar2;
  JSClassID unaff_retaddr;
  JSObject *proto;
  JSShape *sh;
  JSObject *in_stack_ffffffffffffffb8;
  JSRuntime *in_stack_ffffffffffffffc8;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = in_RDX;
  JVar2.u.float64 = in_RSI.float64;
  ctx_00 = (JSContext *)get_proto_obj(JVar2);
  pJVar1 = find_hashed_shape_proto(in_stack_ffffffffffffffc8,(JSObject *)ctx_00);
  if (pJVar1 == (JSShape *)0x0) {
    pJVar1 = js_new_shape(ctx_00,in_stack_ffffffffffffffb8);
    if (pJVar1 == (JSShape *)0x0) {
      local_10.ptr = (void *)(local_10 << 0x20);
      local_8 = 6;
      return _local_10;
    }
  }
  else {
    js_dup_shape(pJVar1);
  }
  JVar2 = JS_NewObjectFromShape((JSContext *)sh,(JSShape *)proto,unaff_retaddr);
  return JVar2;
}

Assistant:

JSValue JS_NewObjectProtoClass(JSContext *ctx, JSValueConst proto_val,
                               JSClassID class_id)
{
    JSShape *sh;
    JSObject *proto;

    proto = get_proto_obj(proto_val);
    sh = find_hashed_shape_proto(ctx->rt, proto);
    if (likely(sh)) {
        sh = js_dup_shape(sh);
    } else {
        sh = js_new_shape(ctx, proto);
        if (!sh)
            return JS_EXCEPTION;
    }
    return JS_NewObjectFromShape(ctx, sh, class_id);
}